

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O1

Error __thiscall
asmjit::RALocalAllocator::switchToAssignment
          (RALocalAllocator *this,PhysToWorkMap *dstPhysToWorkMap,WorkToPhysMap *dstWorkToPhysMap,
          ZoneBitVector *liveIn,bool dstReadOnly,bool tryMode)

{
  RAAssignment *this_00;
  uint32_t *puVar1;
  byte bVar2;
  uint uVar3;
  BaseRAPass *pBVar4;
  PhysToWorkMap *pPVar5;
  PhysToWorkMap *pPVar6;
  uint32_t dstPhysId;
  uint uVar7;
  Error EVar8;
  uint uVar9;
  Error EVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint32_t group;
  int iVar15;
  Error EVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  char cVar20;
  bool bVar21;
  RAAssignment dst;
  uint local_90;
  RAAssignment local_78;
  
  local_78._physToWorkIds[1] = (uint32_t *)0x0;
  local_78._physToWorkIds[2] = (uint32_t *)0x0;
  local_78._physToWorkMap = (PhysToWorkMap *)0x0;
  local_78._physToWorkIds[0] = (uint32_t *)0x0;
  local_78._layout.workRegs = (RAWorkRegs *)0x0;
  local_78._workToPhysMap = (WorkToPhysMap *)0x0;
  local_78._layout.physIndex.super_RARegCount.field_0 = (RARegCount)0x0;
  local_78._layout.physCount.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
  local_78._layout.physTotal = 0;
  local_78._layout.workCount = 0;
  local_78._physToWorkIds[3] = (uint32_t *)0x0;
  pBVar4 = this->_pass;
  bVar2 = (pBVar4->_physRegCount).field_0._regs[0];
  uVar14 = (uint)(pBVar4->_physRegCount).field_0._regs[1] + (uint)bVar2;
  if (uVar14 < 0x100) {
    uVar7 = (pBVar4->_physRegCount).field_0._regs[2] + uVar14;
    if (0xff < uVar7) goto LAB_0011d0ff;
    this_00 = &this->_curAssignment;
    local_78._layout.workRegs = &pBVar4->_workRegs;
    local_78._layout.physIndex.super_RARegCount.field_0 =
         (RARegCount)(uVar7 * 0x1000000 | uVar14 * 0x10000 | (uint)bVar2 << 8);
    local_78._layout.physCount.field_0 =
         (anon_union_4_2_ebeb14a8_for_RARegCount_0)(pBVar4->_physRegCount).field_0._packed;
    EVar16 = ((uint)local_78._layout.physCount.field_0 >> 0x18) +
             ((uint)local_78._layout.physIndex.super_RARegCount.field_0 >> 0x18);
    local_78._layout.workCount = (pBVar4->_workRegs).super_ZoneVectorBase._size;
    local_78._layout.physTotal = EVar16;
    lVar12 = 0;
    do {
      *(uint32_t **)((long)local_78._physToWorkIds + lVar12) =
           dstPhysToWorkMap->workIds +
           ((uint)local_78._layout.physIndex.super_RARegCount.field_0 >> ((byte)lVar12 & 0x1f) &
           0xff);
      lVar12 = lVar12 + 8;
    } while (lVar12 != 0x20);
    if (tryMode) {
      return 0;
    }
    lVar12 = 0;
    local_78._workToPhysMap = dstWorkToPhysMap;
    local_78._physToWorkMap = dstPhysToWorkMap;
    do {
      uVar14 = (((this->_curAssignment)._physToWorkMap)->assigned)._masks[lVar12];
      group = (uint32_t)lVar12;
      if (uVar14 == 0) {
        bVar21 = true;
      }
      else {
        do {
          uVar7 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          uVar19 = 1 << ((byte)uVar7 & 0x1f);
          uVar3 = (this->_curAssignment)._physToWorkIds[lVar12][uVar7];
          uVar17 = (ulong)uVar3;
          if (uVar17 == 0xffffffff) goto LAB_0011d0d2;
          if (liveIn->_size <= uVar3) goto LAB_0011d0d7;
          if ((liveIn->_data[uVar3 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
            RAAssignment::unassign(this_00,group,uVar3,uVar7);
            cVar20 = '\x05';
          }
          else {
            if (local_78._layout.workCount <= uVar3) goto LAB_0011d0dc;
            cVar20 = '\0';
            if (local_78._workToPhysMap[uVar17].physIds[0] == 0xff) {
              if ((((((this->_curAssignment)._physToWorkMap)->dirty)._masks[lVar12] & uVar19) == 0)
                 || (EVar8 = onSaveReg(this,group,uVar3,uVar7), EVar8 == 0)) {
                RAAssignment::unassign(this_00,group,uVar3,uVar7);
                EVar8 = 0;
              }
              cVar20 = EVar8 != 0;
              if ((bool)cVar20) {
                EVar16 = EVar8;
              }
            }
          }
          if ((cVar20 != '\x05') && (cVar20 != '\0')) goto LAB_0011cb14;
          bVar21 = uVar19 != uVar14;
          uVar14 = uVar14 ^ 1 << (uVar7 & 0x1f);
        } while (bVar21);
        cVar20 = '\0';
LAB_0011cb14:
        bVar21 = cVar20 == '\0';
      }
      local_90 = 0;
      if (!bVar21) {
LAB_0011d089:
        bVar21 = false;
        goto LAB_0011d08b;
      }
      uVar14 = ((local_78._physToWorkMap)->assigned)._masks[lVar12];
      iVar15 = -1;
      do {
        if (uVar14 == 0) goto LAB_0011cf6f;
        iVar15 = iVar15 + 1;
        uVar7 = uVar14;
        if (iVar15 == 2) {
          EVar16 = 3;
          break;
        }
        do {
          uVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          uVar18 = 1 << ((byte)uVar3 & 0x1f);
          uVar19 = *(uint *)((long)local_78._physToWorkIds[lVar12] + (ulong)(uVar3 * 4));
          uVar17 = (ulong)uVar19;
          if (uVar17 == 0xffffffff) {
            switchToAssignment();
            goto LAB_0011d089;
          }
          uVar11 = *(uint *)((long)(this->_curAssignment)._physToWorkIds[lVar12] +
                            (ulong)(uVar3 * 4));
          if (uVar11 == 0xffffffff) {
LAB_0011cd9b:
            if ((this->_curAssignment)._layout.workCount <= uVar19) goto LAB_0011d0b9;
            bVar2 = (this->_curAssignment)._workToPhysMap[uVar17].physIds[0];
            if (bVar2 == 0xff) {
              if (liveIn->_size <= uVar19) goto LAB_0011d0c8;
              uVar11 = 0;
              if ((liveIn->_data[uVar19 >> 6] >> (uVar17 & 0x3f) & 1) != 0) {
                uVar11 = uVar18;
              }
              local_90 = local_90 | uVar11;
              uVar14 = uVar14 & ~uVar18;
              cVar20 = '\r';
            }
            else {
              EVar8 = 0;
              if (uVar3 != bVar2) {
                RAAssignment::reassign(this_00,group,uVar19,uVar3,(uint)bVar2);
                EVar8 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[9])
                                  (this->_pass,(ulong)uVar19,(ulong)uVar3,(ulong)bVar2);
              }
              cVar20 = EVar8 != 0;
              if ((bool)cVar20) {
                EVar16 = EVar8;
              }
            }
            EVar8 = EVar16;
            if (cVar20 != '\0') goto LAB_0011cf3d;
LAB_0011ce61:
            uVar11 = ((local_78._physToWorkMap)->dirty)._masks[lVar12];
            pPVar6 = (this->_curAssignment)._physToWorkMap;
            uVar9 = (pPVar6->dirty)._masks[lVar12];
            if (((uVar9 ^ uVar11) & uVar18) != 0) {
              if ((uVar11 & uVar18) == 0) {
                if ((uVar9 & uVar18) == 0) goto LAB_0011d0cd;
                uVar9 = uVar11;
                pPVar6 = local_78._physToWorkMap;
                if (dstReadOnly) {
                  EVar8 = onSaveReg(this,group,uVar19,uVar3);
                  cVar20 = '\x01';
                  if (EVar8 != 0) goto LAB_0011cf3d;
                  goto LAB_0011cef1;
                }
              }
              else if ((uVar9 & uVar18) != 0) goto LAB_0011d0be;
              (pPVar6->dirty)._masks[lVar12] = uVar9 | uVar18;
            }
LAB_0011cef1:
            if (*(int *)((long)local_78._physToWorkIds[lVar12] + (ulong)(uVar3 << 2)) !=
                *(int *)((long)(this->_curAssignment)._physToWorkIds[lVar12] + (ulong)(uVar3 << 2)))
            goto LAB_0011d0af;
            if (((((local_78._physToWorkMap)->dirty)._masks[lVar12] & uVar18) != 0) !=
                (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[lVar12] & uVar18) != 0))
            goto LAB_0011d0b4;
            uVar14 = uVar14 & ~uVar18;
            cVar20 = '\0';
            iVar15 = -1;
            EVar8 = EVar16;
          }
          else {
            if (uVar11 == uVar19) goto LAB_0011ce61;
            if (iVar15 < 1) {
              cVar20 = '\r';
              EVar8 = EVar16;
            }
            else {
              if ((this->_curAssignment)._layout.workCount <= uVar19) goto LAB_0011d0c3;
              bVar2 = (this->_curAssignment)._workToPhysMap[uVar17].physIds[0];
              if (bVar2 == 0xff) {
                cVar20 = '\r';
              }
              else if ((this->_archTraits->_isaFlags[lVar12] & 1) == 0) {
                pPVar5 = (this->_curAssignment)._physToWorkMap;
                if (((pPVar5->dirty)._masks[lVar12] & uVar18) == 0) {
                  RAAssignment::unassign(this_00,group,uVar11,uVar3);
                  cVar20 = '\x19';
                  EVar8 = EVar16;
                }
                else {
                  uVar13 = ~(pPVar5->assigned)._masks[lVar12] &
                           (this->_pass->_availableRegs)._masks[lVar12];
                  uVar9 = ~((local_78._physToWorkMap)->assigned)._masks[lVar12] & uVar13;
                  if (uVar9 == 0) {
                    uVar9 = uVar13;
                  }
                  if (uVar9 == 0) {
                    if ((((((this->_curAssignment)._physToWorkMap)->dirty)._masks[lVar12] & uVar18)
                         == 0) || (EVar10 = onSaveReg(this,group,uVar11,uVar3), EVar10 == 0)) {
                      RAAssignment::unassign(this_00,group,uVar11,uVar3);
                      EVar10 = 0;
                    }
                    if (EVar10 != 0) {
                      EVar16 = EVar10;
                    }
                    cVar20 = '\x01';
                    EVar8 = EVar16;
                    if (EVar10 == 0) {
                      cVar20 = '\x19';
                    }
                  }
                  else {
                    dstPhysId = 0;
                    if (uVar9 != 0) {
                      for (; (uVar9 >> dstPhysId & 1) == 0; dstPhysId = dstPhysId + 1) {
                      }
                    }
                    EVar8 = 0;
                    if (dstPhysId != uVar3) {
                      RAAssignment::reassign(this_00,group,uVar11,dstPhysId,uVar3);
                      EVar8 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[9])
                                        (this->_pass,(ulong)uVar11,(ulong)dstPhysId,(ulong)uVar3);
                    }
                    cVar20 = '\x01';
                    if (EVar8 == 0) {
                      puVar1 = (this->_pass->_clobberedRegs)._masks + lVar12;
                      *puVar1 = *puVar1 | 1 << ((byte)dstPhysId & 0x1f);
                      cVar20 = '\x19';
                      EVar8 = EVar16;
                    }
                  }
                }
                EVar16 = EVar8;
                iVar15 = -1;
              }
              else {
                RAAssignment::swap(this_00,group,uVar11,uVar3,uVar19,(uint)bVar2);
                EVar8 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[10])
                                  (this->_pass,(ulong)uVar11,(ulong)uVar3,uVar17,(ulong)bVar2);
                cVar20 = EVar8 != 0;
                if ((bool)cVar20) {
                  EVar16 = EVar8;
                }
                iVar15 = -1;
              }
              if (cVar20 == '\0') goto LAB_0011ce61;
              EVar8 = EVar16;
              if (cVar20 == '\x19') goto LAB_0011cd9b;
            }
          }
LAB_0011cf3d:
          EVar16 = EVar8;
          if ((cVar20 != '\r') && (cVar20 != '\0')) goto LAB_0011cf5d;
          bVar21 = uVar18 != uVar7;
          uVar7 = uVar7 ^ 1 << (uVar3 & 0x1f);
        } while (bVar21);
        cVar20 = '\0';
LAB_0011cf5d:
      } while (cVar20 == '\0');
      bVar21 = false;
      EVar8 = EVar16;
LAB_0011d069:
      EVar16 = EVar8;
      if (!bVar21) goto LAB_0011d089;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    bVar21 = true;
LAB_0011d08b:
    if (!bVar21) {
      return EVar16;
    }
    bVar21 = RAAssignment::equals(&local_78,this_00);
    if (bVar21) {
      return 0;
    }
    switchToAssignment();
LAB_0011d0af:
    switchToAssignment();
LAB_0011d0b4:
    switchToAssignment();
LAB_0011d0b9:
    switchToAssignment();
LAB_0011d0be:
    switchToAssignment();
LAB_0011d0c3:
    switchToAssignment();
LAB_0011d0c8:
    switchToAssignment();
LAB_0011d0cd:
    switchToAssignment();
LAB_0011d0d2:
    switchToAssignment();
LAB_0011d0d7:
    switchToAssignment();
LAB_0011d0dc:
    switchToAssignment();
LAB_0011d0e1:
    switchToAssignment();
LAB_0011d0e6:
    switchToAssignment();
LAB_0011d0eb:
    switchToAssignment();
    switchToAssignment();
    switchToAssignment();
  }
  switchToAssignment();
LAB_0011d0ff:
  switchToAssignment();
LAB_0011d104:
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O1/_deps/asmjit-src/src/asmjit/core/ralocal.cpp"
             ,0x159,"tryMode == true");
LAB_0011cf6f:
  bVar21 = local_90 == 0;
  EVar8 = EVar16;
  if (bVar21) goto LAB_0011d069;
  uVar14 = 0;
  if (local_90 != 0) {
    for (; (local_90 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
    }
  }
  uVar7 = 1 << ((byte)uVar14 & 0x1f);
  if (((((this->_curAssignment)._physToWorkMap)->assigned)._masks[lVar12] >> (uVar14 & 0x1f) & 1) !=
      0) goto LAB_0011d104;
  uVar3 = local_78._physToWorkIds[lVar12][uVar14];
  if (liveIn->_size <= uVar3) goto LAB_0011d0e1;
  if ((liveIn->_data[uVar3 >> 6] >> ((ulong)uVar3 & 0x3f) & 1) == 0) goto LAB_0011d0e6;
  RAAssignment::assign(this_00,group,uVar3,uVar14,0);
  EVar8 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xb])
                    (this->_pass,(ulong)uVar3,(ulong)uVar14);
  if (EVar8 != 0) goto LAB_0011d069;
  if ((((local_78._physToWorkMap)->dirty)._masks[lVar12] & uVar7) != 0) {
    puVar1 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks + lVar12;
    *puVar1 = *puVar1 | uVar7;
  }
  local_90 = local_90 ^ 1 << (uVar14 & 0x1f);
  if (((((local_78._physToWorkMap)->dirty)._masks[lVar12] & uVar7) != 0) !=
      (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[lVar12] & uVar7) != 0))
  goto LAB_0011d0eb;
  goto LAB_0011cf6f;
}

Assistant:

Error RALocalAllocator::switchToAssignment(
  PhysToWorkMap* dstPhysToWorkMap,
  WorkToPhysMap* dstWorkToPhysMap,
  const ZoneBitVector& liveIn,
  bool dstReadOnly,
  bool tryMode) noexcept {

  RAAssignment dst;
  RAAssignment& cur = _curAssignment;

  dst.initLayout(_pass->_physRegCount, _pass->workRegs());
  dst.initMaps(dstPhysToWorkMap, dstWorkToPhysMap);

  if (tryMode)
    return kErrorOk;

  for (uint32_t group = 0; group < BaseReg::kGroupVirt; group++) {
    // ------------------------------------------------------------------------
    // STEP 1:
    //   - KILL all registers that are not live at `dst`,
    //   - SPILL all registers that are not assigned at `dst`.
    // ------------------------------------------------------------------------

    if (!tryMode) {
      Support::BitWordIterator<uint32_t> it(cur.assigned(group));
      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t workId = cur.physToWorkId(group, physId);

        // Must be true as we iterate over assigned registers.
        ASMJIT_ASSERT(workId != RAAssignment::kWorkNone);

        // KILL if it's not live on entry.
        if (!liveIn.bitAt(workId)) {
          onKillReg(group, workId, physId);
          continue;
        }

        // SPILL if it's not assigned on entry.
        uint32_t altId = dst.workToPhysId(group, workId);
        if (altId == RAAssignment::kPhysNone) {
          ASMJIT_PROPAGATE(onSpillReg(group, workId, physId));
        }
      }
    }

    // ------------------------------------------------------------------------
    // STEP 2:
    //   - MOVE and SWAP registers from their current assignments into their
    //     DST assignments.
    //   - Build `willLoadRegs` mask of registers scheduled for `onLoadReg()`.
    // ------------------------------------------------------------------------

    // Current run-id (1 means more aggressive decisions).
    int32_t runId = -1;
    // Remaining registers scheduled for `onLoadReg()`.
    uint32_t willLoadRegs = 0;
    // Remaining registers to be allocated in this loop.
    uint32_t affectedRegs = dst.assigned(group);

    while (affectedRegs) {
      if (++runId == 2) {
        if (!tryMode)
          return DebugUtils::errored(kErrorInvalidState);

        // Stop in `tryMode` if we haven't done anything in past two rounds.
        break;
      }

      Support::BitWordIterator<uint32_t> it(affectedRegs);
      while (it.hasNext()) {
        uint32_t physId = it.next();
        uint32_t physMask = Support::bitMask(physId);

        uint32_t curWorkId = cur.physToWorkId(group, physId);
        uint32_t dstWorkId = dst.physToWorkId(group, physId);

        // The register must have assigned `dstWorkId` as we only iterate over assigned regs.
        ASMJIT_ASSERT(dstWorkId != RAAssignment::kWorkNone);

        if (curWorkId != RAAssignment::kWorkNone) {
          // Both assigned.
          if (curWorkId != dstWorkId) {
            // Wait a bit if this is the first run, we may avoid this if `curWorkId` moves out.
            if (runId <= 0)
              continue;

            uint32_t altPhysId = cur.workToPhysId(group, dstWorkId);
            if (altPhysId == RAAssignment::kPhysNone)
              continue;

            // Reset as we will do some changes to the current assignment.
            runId = -1;

            if (_archTraits->hasSwap(group)) {
              ASMJIT_PROPAGATE(onSwapReg(group, curWorkId, physId, dstWorkId, altPhysId));
            }
            else {
              // SPILL the reg if it's not dirty in DST, otherwise try to MOVE.
              if (!cur.isPhysDirty(group, physId)) {
                ASMJIT_PROPAGATE(onKillReg(group, curWorkId, physId));
              }
              else {
                uint32_t allocableRegs = _pass->_availableRegs[group] & ~cur.assigned(group);

                // If possible don't conflict with assigned regs at DST.
                if (allocableRegs & ~dst.assigned(group))
                  allocableRegs &= ~dst.assigned(group);

                if (allocableRegs) {
                  // MOVE is possible, thus preferred.
                  uint32_t tmpPhysId = Support::ctz(allocableRegs);

                  ASMJIT_PROPAGATE(onMoveReg(group, curWorkId, tmpPhysId, physId));
                  _pass->_clobberedRegs[group] |= Support::bitMask(tmpPhysId);
                }
                else {
                  // MOVE is impossible, must SPILL.
                  ASMJIT_PROPAGATE(onSpillReg(group, curWorkId, physId));
                }
              }

              goto Cleared;
            }
          }
        }
        else {
Cleared:
          // DST assigned, CUR unassigned.
          uint32_t altPhysId = cur.workToPhysId(group, dstWorkId);
          if (altPhysId == RAAssignment::kPhysNone) {
            if (liveIn.bitAt(dstWorkId))
              willLoadRegs |= physMask; // Scheduled for `onLoadReg()`.
            affectedRegs &= ~physMask;  // Unaffected from now.
            continue;
          }
          ASMJIT_PROPAGATE(onMoveReg(group, dstWorkId, physId, altPhysId));
        }

        // Both DST and CUR assigned to the same reg or CUR just moved to DST.
        if ((dst.dirty(group) & physMask) != (cur.dirty(group) & physMask)) {
          if ((dst.dirty(group) & physMask) == 0) {
            // CUR dirty, DST not dirty (the assert is just to visualize the condition).
            ASMJIT_ASSERT(!dst.isPhysDirty(group, physId) && cur.isPhysDirty(group, physId));

            // If `dstReadOnly` is true it means that that block was already
            // processed and we cannot change from CLEAN to DIRTY. In that case
            // the register has to be saved as it cannot enter the block DIRTY.
            if (dstReadOnly)
              ASMJIT_PROPAGATE(onSaveReg(group, dstWorkId, physId));
            else
              dst.makeDirty(group, dstWorkId, physId);
          }
          else {
            // DST dirty, CUR not dirty (the assert is just to visualize the condition).
            ASMJIT_ASSERT(dst.isPhysDirty(group, physId) && !cur.isPhysDirty(group, physId));

            cur.makeDirty(group, dstWorkId, physId);
          }
        }

        // Must match now...
        ASMJIT_ASSERT(dst.physToWorkId(group, physId) == cur.physToWorkId(group, physId));
        ASMJIT_ASSERT(dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId));

        runId = -1;
        affectedRegs &= ~physMask;
      }
    }

    // ------------------------------------------------------------------------
    // STEP 3:
    //   - Load registers specified by `willLoadRegs`.
    // ------------------------------------------------------------------------

    {
      Support::BitWordIterator<uint32_t> it(willLoadRegs);
      while (it.hasNext()) {
        uint32_t physId = it.next();

        if (!cur.isPhysAssigned(group, physId)) {
          uint32_t workId = dst.physToWorkId(group, physId);

          // The algorithm is broken if it tries to load a register that is not in LIVE-IN.
          ASMJIT_ASSERT(liveIn.bitAt(workId) == true);

          ASMJIT_PROPAGATE(onLoadReg(group, workId, physId));
          if (dst.isPhysDirty(group, physId))
            cur.makeDirty(group, workId, physId);
          ASMJIT_ASSERT(dst.isPhysDirty(group, physId) == cur.isPhysDirty(group, physId));
        }
        else {
          // Not possible otherwise.
          ASMJIT_ASSERT(tryMode == true);
        }
      }
    }
  }

  if (!tryMode) {
    // Hre is a code that dumps the conflicting part if something fails here:
    //   if (!dst.equals(cur)) {
    //     uint32_t physTotal = dst._layout.physTotal;
    //     uint32_t workCount = dst._layout.workCount;
    //
    //     for (uint32_t physId = 0; physId < physTotal; physId++) {
    //       uint32_t dstWorkId = dst._physToWorkMap->workIds[physId];
    //       uint32_t curWorkId = cur._physToWorkMap->workIds[physId];
    //       if (dstWorkId != curWorkId)
    //         fprintf(stderr, "[PhysIdWork] PhysId=%u WorkId[DST(%u) != CUR(%u)]\n", physId, dstWorkId, curWorkId);
    //     }
    //
    //     for (uint32_t workId = 0; workId < workCount; workId++) {
    //       uint32_t dstPhysId = dst._workToPhysMap->physIds[workId];
    //       uint32_t curPhysId = cur._workToPhysMap->physIds[workId];
    //       if (dstPhysId != curPhysId)
    //         fprintf(stderr, "[WorkToPhys] WorkId=%u PhysId[DST(%u) != CUR(%u)]\n", workId, dstPhysId, curPhysId);
    //     }
    //   }
    ASMJIT_ASSERT(dst.equals(cur));
  }

  return kErrorOk;
}